

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void gl4cts::CopyImage::Utils::readChannel
               (GLenum type,GLuint channel,GLubyte *pixel,GLdouble *value)

{
  TestError *this;
  GLdouble *value_local;
  GLubyte *pixel_local;
  GLuint channel_local;
  GLenum type_local;
  
  if (type == 0x1400) {
    readBaseTypeFromSignedChannel<signed_char>(channel,pixel,value);
  }
  else if (type == 0x1401) {
    readBaseTypeFromUnsignedChannel<unsigned_char>(channel,pixel,value);
  }
  else if (type == 0x1402) {
    readBaseTypeFromSignedChannel<short>(channel,pixel,value);
  }
  else if (type == 0x1403) {
    readBaseTypeFromUnsignedChannel<unsigned_short>(channel,pixel,value);
  }
  else if (type == 0x1404) {
    readBaseTypeFromSignedChannel<int>(channel,pixel,value);
  }
  else if (type == 0x1405) {
    readBaseTypeFromUnsignedChannel<unsigned_int>(channel,pixel,value);
  }
  else if (type == 0x1406) {
    readBaseTypeFromFloatChannel(channel,pixel,value);
  }
  else if (type == 0x140b) {
    readBaseTypeFromHalfFloatChannel(channel,pixel,value);
  }
  else if (type == 0x8032) {
    read3Channel<unsigned_char,3u,3u,2u,5u,2u,0u>(channel,pixel,value);
  }
  else if (type == 0x8033) {
    read4Channel<unsigned_short,4u,4u,4u,4u,12u,8u,4u,0u>(channel,pixel,value);
  }
  else if (type == 0x8034) {
    read4Channel<unsigned_short,5u,5u,5u,1u,11u,6u,1u,0u>(channel,pixel,value);
  }
  else if (type == 0x8363) {
    read3Channel<unsigned_short,5u,6u,5u,11u,5u,0u>(channel,pixel,value);
  }
  else if (type == 0x8368) {
    read4Channel<unsigned_int,2u,10u,10u,10u,30u,20u,10u,0u>(3 - channel,pixel,value);
  }
  else if (type == 0x8c3b) {
    read11F_11F_10F_Channel(channel,pixel,value);
  }
  else {
    if (type != 0x8c3e) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                 ,0x923);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    read4Channel<unsigned_int,5u,9u,9u,9u,27u,18u,9u,0u>(3 - channel,pixel,value);
  }
  return;
}

Assistant:

void Utils::readChannel(GLenum type, GLuint channel, const GLubyte* pixel, GLdouble& value)
{
	switch (type)
	{
	/* Base types */
	case GL_UNSIGNED_BYTE:
		readBaseTypeFromUnsignedChannel<GLubyte>(channel, pixel, value);
		break;
	case GL_UNSIGNED_SHORT:
		readBaseTypeFromUnsignedChannel<GLushort>(channel, pixel, value);
		break;
	case GL_UNSIGNED_INT:
		readBaseTypeFromUnsignedChannel<GLuint>(channel, pixel, value);
		break;
	case GL_BYTE:
		readBaseTypeFromSignedChannel<GLbyte>(channel, pixel, value);
		break;
	case GL_SHORT:
		readBaseTypeFromSignedChannel<GLshort>(channel, pixel, value);
		break;
	case GL_INT:
		readBaseTypeFromSignedChannel<GLint>(channel, pixel, value);
		break;
	case GL_HALF_FLOAT:
		readBaseTypeFromHalfFloatChannel(channel, pixel, value);
		break;
	case GL_FLOAT:
		readBaseTypeFromFloatChannel(channel, pixel, value);
		break;

	/* Complicated */
	/* 3 channles */
	case GL_UNSIGNED_BYTE_3_3_2:
		read3Channel<GLubyte, 3, 3, 2, 5, 2, 0>(channel, pixel, value);
		break;
	case GL_UNSIGNED_SHORT_5_6_5:
		read3Channel<GLushort, 5, 6, 5, 11, 5, 0>(channel, pixel, value);
		break;

	/* 4 channels */
	case GL_UNSIGNED_SHORT_4_4_4_4:
		read4Channel<GLushort, 4, 4, 4, 4, 12, 8, 4, 0>(channel, pixel, value);
		break;
	case GL_UNSIGNED_SHORT_5_5_5_1:
		read4Channel<GLushort, 5, 5, 5, 1, 11, 6, 1, 0>(channel, pixel, value);
		break;
	case GL_UNSIGNED_INT_2_10_10_10_REV:
		read4Channel<GLuint, 2, 10, 10, 10, 30, 20, 10, 0>(3 - channel, pixel, value);
		break;
	case GL_UNSIGNED_INT_5_9_9_9_REV:
		read4Channel<GLuint, 5, 9, 9, 9, 27, 18, 9, 0>(3 - channel, pixel, value);
		break;

	/* R11F_G11F_B10F - uber complicated */
	case GL_UNSIGNED_INT_10F_11F_11F_REV:
		read11F_11F_10F_Channel(channel, pixel, value);
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}
}